

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *window,int n)

{
  ImGuiID IVar1;
  int n_local;
  
  if ((uint)n < 8) {
    IVar1 = ImHashStr("#RESIZE",0,window->ID);
    IVar1 = ImHashData(&n_local,4,IVar1);
    return IVar1;
  }
  __assert_fail("n >= 0 && n <= 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                ,0x1441,"ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *, int)");
}

Assistant:

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n <= 7);
    ImGuiID id = window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}